

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

void ForgetEmptyComponents
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *components)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  __position;
  iterator it;
  __node_type *in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  in_stack_ffffffffffffffe0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_10 [2];
  
  local_10[0]._M_cur =
       (__node_type *)
       std::
       begin<std::unordered_map<std::__cxx11::string,Component*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Component*>>>>
                 (in_stack_ffffffffffffffd8);
  while( true ) {
    __position._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,Component*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Component*>>>>
                   (in_stack_ffffffffffffffd8);
    bVar1 = std::__detail::operator!=
                      (local_10,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
                                 *)&stack0xffffffffffffffe8);
    if (!bVar1) break;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                  *)0x175cc6);
    bVar1 = std::
            unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
            ::empty((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                     *)0x175cd6);
    if (bVar1) {
      in_stack_ffffffffffffffe0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
           ::erase(in_stack_ffffffffffffffe0._M_cur,__position._M_cur);
      in_stack_ffffffffffffffd8 = local_10[0]._M_cur;
      local_10[0]._M_cur = in_stack_ffffffffffffffe0._M_cur;
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                    *)in_stack_ffffffffffffffe0._M_cur);
    }
  }
  return;
}

Assistant:

void ForgetEmptyComponents(std::unordered_map<std::string, Component *> &components) {
  for (auto it = begin(components); it != end(components);) {
    if (it->second->files.empty())
      it = components.erase(it);
    else
      ++it;
  }
}